

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

void __thiscall crnlib::Resampler::restart(Resampler *this)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  int j;
  int i;
  undefined4 local_10;
  undefined4 local_c;
  
  if (*(int *)(in_RDI + 0x68) == 0) {
    *(undefined4 *)(in_RDI + 100) = 0;
    *(undefined4 *)(in_RDI + 0x60) = 0;
    for (local_c = 0; local_c < *(int *)(in_RDI + 0xc); local_c = local_c + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x48) + (long)local_c * 4) = 0;
      *(undefined1 *)(*(long *)(in_RDI + 0x50) + (long)local_c) = 0;
    }
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x14); local_c = local_c + 1) {
      for (local_10 = 0;
          local_10 < (int)(uint)*(ushort *)(*(long *)(in_RDI + 0x38) + (long)local_c * 0x10);
          local_10 = local_10 + 1) {
        lVar1 = *(long *)(in_RDI + 0x48);
        iVar2 = resampler_range_check
                          ((uint)*(ushort *)
                                  (*(long *)(*(long *)(in_RDI + 0x38) + (long)local_c * 0x10 + 8) +
                                   4 + (long)local_10 * 8),*(int *)(in_RDI + 0xc));
        *(int *)(lVar1 + (long)iVar2 * 4) = *(int *)(lVar1 + (long)iVar2 * 4) + 1;
      }
    }
    for (local_c = 0; local_c < 0x4000; local_c = local_c + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x58) + (long)local_c * 4) = 0xffffffff;
      crnlib_free((void *)0x1964cc);
      *(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x10000 + (long)local_c * 8) = 0;
    }
  }
  return;
}

Assistant:

void Resampler::restart() {
  if (STATUS_OKAY != m_status)
    return;

  m_cur_src_y = m_cur_dst_y = 0;

  int i, j;
  for (i = 0; i < m_resample_src_y; i++) {
    m_Psrc_y_count[i] = 0;
    m_Psrc_y_flag[i] = FALSE;
  }

  for (i = 0; i < m_resample_dst_y; i++) {
    for (j = 0; j < m_Pclist_y[i].n; j++)
      m_Psrc_y_count[resampler_range_check(m_Pclist_y[i].p[j].pixel, m_resample_src_y)]++;
  }

  for (i = 0; i < MAX_SCAN_BUF_SIZE; i++) {
    m_Pscan_buf->scan_buf_y[i] = -1;

    crnlib_free(m_Pscan_buf->scan_buf_l[i]);
    m_Pscan_buf->scan_buf_l[i] = NULL;
  }
}